

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O2

double __thiscall xmrig::Hashrate::calc(Hashrate *this,size_t ms)

{
  size_t i;
  ulong threadId;
  double dVar1;
  double local_28;
  
  local_28 = 0.0;
  for (threadId = 0; threadId < this->m_threads; threadId = threadId + 1) {
    dVar1 = calc(this,threadId,ms);
    if ((uint)((long)ABS(dVar1) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
      local_28 = local_28 + dVar1;
    }
  }
  return local_28;
}

Assistant:

double xmrig::Hashrate::calc(size_t ms) const
{
    double result = 0.0;
    double data;

    for (size_t i = 0; i < m_threads; ++i) {
        data = calc(i, ms);
        if (std::isnormal(data)) {
            result += data;
        }
    }

    return result;
}